

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

bool __thiscall S2Polygon::Equals(S2Polygon *this,S2Polygon *b)

{
  pointer puVar1;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> b_00;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> this_00;
  bool bVar2;
  long lVar3;
  bool bVar4;
  int i;
  long lVar5;
  
  if ((int)((ulong)((long)(this->loops_).
                          super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->loops_).
                         super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) ==
      (int)((ulong)((long)(b->loops_).
                          super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(b->loops_).
                         super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar5 = 0;
    do {
      puVar1 = (this->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = (long)(int)((ulong)((long)(this->loops_).
                                        super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1)
                         >> 3);
      bVar4 = lVar3 <= lVar5;
      if (lVar3 <= lVar5) {
        return bVar4;
      }
      b_00._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
      super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
           puVar1[lVar5]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
      this_00._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
      super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
           (b->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar5]._M_t.
           super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
      if (*(int *)((long)this_00._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>
                         .super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 8) !=
          *(int *)((long)b_00._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                         super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 8)) {
        return bVar4;
      }
      bVar2 = S2Loop::Equals((S2Loop *)
                             this_00._M_t.
                             super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                             super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl,
                             (S2Loop *)
                             b_00._M_t.
                             super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                             super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl);
      lVar5 = lVar5 + 1;
    } while (bVar2);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

void S2Polygon::InitToUnion(
    const S2Polygon& a, const S2Polygon& b,
    const S2Builder::SnapFunction& snap_function) {
  InitToOperation(S2BooleanOperation::OpType::UNION, snap_function, a, b);
}